

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * re2::CEscape_abi_cxx11_(StringPiece *src)

{
  size_type sVar1;
  size_t sVar2;
  StringPiece *in_RSI;
  string *in_RDI;
  size_t used;
  char *dest;
  size_t dest_len;
  string *s;
  string *this;
  char *in_stack_ffffffffffffffa8;
  char *pcVar3;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  allocator *paVar4;
  allocator local_2a;
  undefined1 local_29;
  size_t local_28;
  char *local_20;
  ulong local_18;
  StringPiece *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  sVar1 = StringPiece::size(in_RSI);
  local_18 = sVar1 * 4 + 1;
  local_20 = (char *)operator_new__(local_18);
  StringPiece::data(local_10);
  StringPiece::size(local_10);
  sVar2 = CEscapeString(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8,(size_t)this);
  local_29 = 0;
  paVar4 = &local_2a;
  pcVar3 = local_20;
  local_28 = sVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar3,sVar2,paVar4);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  if (local_20 != (char *)0x0) {
    operator_delete__(local_20);
  }
  return in_RDI;
}

Assistant:

std::string CEscape(const StringPiece& src) {
  const size_t dest_len = src.size() * 4 + 1; // Maximum possible expansion
  char* dest = new char[dest_len];
  const size_t used = CEscapeString(src.data(), src.size(),
                                    dest, dest_len);
  std::string s = std::string(dest, used);
  delete[] dest;
  return s;
}